

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QStringList * __thiscall QAccessibleWidget::actionNames(QAccessibleWidget *this)

{
  bool bVar1;
  FocusPolicy FVar2;
  QWidget *this_00;
  QStringList *in_RDI;
  QStringList *names;
  parameter_type in_stack_ffffffffffffffc8;
  QStringList *this_01;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x7de4d3);
  widget((QAccessibleWidget *)0x7de4dd);
  bVar1 = QWidget::isEnabled((QWidget *)0x7de4e5);
  if (bVar1) {
    this_00 = widget((QAccessibleWidget *)0x7de4f5);
    FVar2 = QWidget::focusPolicy(this_00);
    if (FVar2 != NoFocus) {
      QAccessibleActionInterface::setFocusAction();
      QList<QString>::operator<<(this_01,in_stack_ffffffffffffffc8);
    }
  }
  return in_RDI;
}

Assistant:

QStringList QAccessibleWidget::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
        if (widget()->focusPolicy() != Qt::NoFocus)
            names << setFocusAction();
    }
    return names;
}